

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

ExprPtr __thiscall pegmatite::set(pegmatite *this,char *s)

{
  Expr *__p;
  _Bit_type *p_Var1;
  byte bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint uVar3;
  byte *pbVar4;
  ExprPtr EVar5;
  
  __p = (Expr *)operator_new(0x30);
  __p->_vptr_Expr = (_func_int **)&PTR__SetExpr_001580e0;
  __p[1]._vptr_Expr = (_func_int **)0x0;
  *(undefined4 *)&__p[2]._vptr_Expr = 0;
  __p[3]._vptr_Expr = (_func_int **)0x0;
  *(undefined4 *)&__p[4]._vptr_Expr = 0;
  __p[5]._vptr_Expr = (_func_int **)0x0;
  bVar2 = *s;
  if (bVar2 != 0) {
    pbVar4 = (byte *)(s + 1);
    p_Var1 = (_Bit_type *)0x0;
    do {
      uVar3 = (uint)(char)bVar2;
      if ((ulong)*(uint *)&__p[4]._vptr_Expr + ((long)__p[3]._vptr_Expr - (long)p_Var1) * 8 <=
          (ulong)uVar3) {
        std::vector<bool,_std::allocator<bool>_>::resize
                  ((vector<bool,_std::allocator<bool>_> *)(__p + 1),(ulong)(uVar3 + 1),false);
        p_Var1 = (((vector<bool,_std::allocator<bool>_> *)(__p + 1))->
                 super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                 _M_start.super__Bit_iterator_base._M_p;
      }
      p_Var1[uVar3 >> 6] = p_Var1[uVar3 >> 6] | 1L << (bVar2 & 0x3f);
      bVar2 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    } while (bVar2 != 0);
  }
  *(Expr **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<pegmatite::Expr*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  EVar5.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar5.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ExprPtr)EVar5.super_shared_ptr<pegmatite::Expr>.
                  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr set(const char *s)
{
	return ExprPtr(new SetExpr(s));
}